

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O1

size_t dw2ascii(uint8_t *string,size_t bufsize)

{
  size_t sVar1;
  uint8_t uVar2;
  
  if (bufsize != 0) {
    sVar1 = 0;
    do {
      uVar2 = ' ';
      if ((ulong)string[sVar1] < 0x61) {
        uVar2 = "0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ[]\'*>_:=_.,-_?!;)(``/\'___________ \n"
                [string[sVar1]];
      }
      string[sVar1] = uVar2;
      sVar1 = sVar1 + 1;
    } while (bufsize != sVar1);
  }
  return bufsize;
}

Assistant:

size_t dw2ascii(uint8_t *string, size_t bufsize)
{
    size_t i, alphalen;

    alphalen = strlen(alphabet);
    for (i=0; i < bufsize; i++) {
        if (string[i] < alphalen) {
            string[i] = alphabet[string[i]];
        } else {
            string[i] = ' ';
        }
    }
    return bufsize;
}